

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cc
# Opt level: O1

finite_path_t *
tchecker::zg::path::symbolic::compute_finite_path
          (shared_ptr<tchecker::zg::zg_t> *zg,vloc_t *initial_vloc,
          vector<tchecker::intrusive_shared_ptr_t<const_tchecker::make_shared_t<tchecker::vedge_t,_unsigned_long,_1UL>_>,_std::allocator<tchecker::intrusive_shared_ptr_t<const_tchecker::make_shared_t<tchecker::vedge_t,_unsigned_long,_1UL>_>_>_>
          *seq,bool last_node_final)

{
  pointer piVar1;
  finite_path_t<tchecker::zg::zg_t,_tchecker::zg::path::symbolic::node_t,_tchecker::zg::path::symbolic::edge_t>
  *this;
  invalid_argument *piVar2;
  undefined7 in_register_00000009;
  pointer piVar3;
  const_state_sptr_t s;
  intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::zg::path::symbolic::node_t,_tchecker::zg::path::symbolic::edge_t>,_unsigned_long,_1UL>_>
  local_60;
  intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>
  local_58;
  intrusive_shared_ptr_t<const_tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>
  local_50;
  intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::zg::path::symbolic::node_t,_tchecker::zg::path::symbolic::edge_t>,_unsigned_long,_1UL>_>
  local_48;
  undefined4 local_3c;
  shared_ptr<tchecker::zg::zg_t> *local_38;
  
  this = (finite_path_t<tchecker::zg::zg_t,_tchecker::zg::path::symbolic::node_t,_tchecker::zg::path::symbolic::edge_t>
          *)operator_new(0xf8);
  tchecker::ts::
  finite_path_t<tchecker::zg::zg_t,_tchecker::zg::path::symbolic::node_t,_tchecker::zg::path::symbolic::edge_t>
  ::finite_path_t(this,zg);
  (this->
  super_finite_path_t<tchecker::zg::path::symbolic::node_t,_tchecker::zg::path::symbolic::edge_t>).
  super_multigraph_t<tchecker::zg::path::symbolic::node_t,_tchecker::zg::path::symbolic::edge_t>.
  _vptr_multigraph_t = (_func_int **)&PTR__finite_path_t_0027bb18;
  zg::initial((zg *)&local_60,
              (zg->super___shared_ptr<tchecker::zg::zg_t,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
              initial_vloc,1);
  intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,unsigned_long,1ul>const>::
  intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,unsigned_long,1ul>>
            ((intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,unsigned_long,1ul>const>
              *)&local_50,
             (intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>
              *)&local_60);
  intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>::
  ~intrusive_shared_ptr_t
            ((intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>
              *)&local_60);
  if (local_50._t == (make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL> *)0x0) {
    (*(this->
      super_finite_path_t<tchecker::zg::path::symbolic::node_t,_tchecker::zg::path::symbolic::edge_t>
      ).
      super_multigraph_t<tchecker::zg::path::symbolic::node_t,_tchecker::zg::path::symbolic::edge_t>
      ._vptr_multigraph_t[1])(this);
    piVar2 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument
              (piVar2,
               "*** compute_finite_path(symbolic): no initial state with given tuple of locations");
    __cxa_throw(piVar2,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  graph::finite_path_t<tchecker::zg::path::symbolic::node_t,tchecker::zg::path::symbolic::edge_t>::
  add_first_node<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,unsigned_long,1ul>const>>
            ((finite_path_t<tchecker::zg::path::symbolic::node_t,tchecker::zg::path::symbolic::edge_t>
              *)this,&local_50);
  local_60._t = (make_shared_t<tchecker::graph::reachability::node_t<tchecker::zg::path::symbolic::node_t,_tchecker::zg::path::symbolic::edge_t>,_unsigned_long,_1UL>
                 *)0x0;
  intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::zg::path::symbolic::node_t,_tchecker::zg::path::symbolic::edge_t>,_unsigned_long,_1UL>_>
  ::reset(&local_60,
          (this->
          super_finite_path_t<tchecker::zg::path::symbolic::node_t,_tchecker::zg::path::symbolic::edge_t>
          )._first._t);
  if ((node_flags_t *)local_60._t != (node_flags_t *)0x0) {
    local_3c = (undefined4)CONCAT71(in_register_00000009,last_node_final);
    local_38 = zg;
    graph::node_flags_t::initial((node_flags_t *)local_60._t,true);
    intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::zg::path::symbolic::node_t,_tchecker::zg::path::symbolic::edge_t>,_unsigned_long,_1UL>_>
    ::~intrusive_shared_ptr_t(&local_60);
    piVar3 = (seq->
             super__Vector_base<tchecker::intrusive_shared_ptr_t<const_tchecker::make_shared_t<tchecker::vedge_t,_unsigned_long,_1UL>_>,_std::allocator<tchecker::intrusive_shared_ptr_t<const_tchecker::make_shared_t<tchecker::vedge_t,_unsigned_long,_1UL>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    piVar1 = (seq->
             super__Vector_base<tchecker::intrusive_shared_ptr_t<const_tchecker::make_shared_t<tchecker::vedge_t,_unsigned_long,_1UL>_>,_std::allocator<tchecker::intrusive_shared_ptr_t<const_tchecker::make_shared_t<tchecker::vedge_t,_unsigned_long,_1UL>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    if (piVar3 != piVar1) {
      do {
        local_48._t = (make_shared_t<tchecker::graph::reachability::node_t<tchecker::zg::path::symbolic::node_t,_tchecker::zg::path::symbolic::edge_t>,_unsigned_long,_1UL>
                       *)0x0;
        intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::zg::path::symbolic::node_t,_tchecker::zg::path::symbolic::edge_t>,_unsigned_long,_1UL>_>
        ::reset(&local_48,
                (this->
                super_finite_path_t<tchecker::zg::path::symbolic::node_t,_tchecker::zg::path::symbolic::edge_t>
                )._last._t);
        if (local_48._t ==
            (make_shared_t<tchecker::graph::reachability::node_t<tchecker::zg::path::symbolic::node_t,_tchecker::zg::path::symbolic::edge_t>,_unsigned_long,_1UL>
             *)0x0) goto LAB_001ab328;
        local_60._t = (make_shared_t<tchecker::graph::reachability::node_t<tchecker::zg::path::symbolic::node_t,_tchecker::zg::path::symbolic::edge_t>,_unsigned_long,_1UL>
                       *)0x0;
        intrusive_shared_ptr_t<const_tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>
        ::reset((intrusive_shared_ptr_t<const_tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>
                 *)&local_60,
                ((local_48._t)->
                super_node_t<tchecker::zg::path::symbolic::node_t,_tchecker::zg::path::symbolic::edge_t>
                ).super_node_t.super_node_zg_state_t._state._t);
        intrusive_shared_ptr_t<const_tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>
        ::operator=(&local_50,
                    (intrusive_shared_ptr_t<const_tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>
                     *)&local_60);
        intrusive_shared_ptr_t<const_tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>
        ::~intrusive_shared_ptr_t
                  ((intrusive_shared_ptr_t<const_tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>
                    *)&local_60);
        intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::zg::path::symbolic::node_t,_tchecker::zg::path::symbolic::edge_t>,_unsigned_long,_1UL>_>
        ::~intrusive_shared_ptr_t(&local_48);
        if (&piVar3->_t->super_vedge_t == (vedge_t *)0x0) {
          __assert_fail("_t != nullptr",
                        "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/../include/tchecker/utils/shared_objects.hh"
                        ,0x1d0,
                        "T &tchecker::intrusive_shared_ptr_t<const tchecker::make_shared_t<tchecker::vedge_t>>::operator*() const [T = const tchecker::make_shared_t<tchecker::vedge_t>]"
                       );
        }
        zg::next((zg *)&local_60,
                 (local_38->super___shared_ptr<tchecker::zg::zg_t,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr,&local_50,&piVar3->_t->super_vedge_t,1);
        if ((local_58._t == (make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL> *)0x0) ||
           ((node_flags_t *)local_60._t == (node_flags_t *)0x0)) {
          (*(this->
            super_finite_path_t<tchecker::zg::path::symbolic::node_t,_tchecker::zg::path::symbolic::edge_t>
            ).
            super_multigraph_t<tchecker::zg::path::symbolic::node_t,_tchecker::zg::path::symbolic::edge_t>
            ._vptr_multigraph_t[1])(this);
          piVar2 = (invalid_argument *)__cxa_allocate_exception(0x10);
          std::invalid_argument::invalid_argument
                    (piVar2,
                     "*** compute_finite_path(symbolic): sequence is not feasible from given initial locations"
                    );
          __cxa_throw(piVar2,&std::invalid_argument::typeinfo,
                      std::invalid_argument::~invalid_argument);
        }
        graph::
        finite_path_t<tchecker::zg::path::symbolic::node_t,tchecker::zg::path::symbolic::edge_t>::
        extend_back<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::transition_t,unsigned_long,1ul>>,tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,unsigned_long,1ul>>>
                  ((finite_path_t<tchecker::zg::path::symbolic::node_t,tchecker::zg::path::symbolic::edge_t>
                    *)this,(intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::transition_t,_unsigned_long,_1UL>_>
                            *)&local_60,&local_58);
        intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>
        ::~intrusive_shared_ptr_t(&local_58);
        intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::transition_t,_unsigned_long,_1UL>_>
        ::~intrusive_shared_ptr_t
                  ((intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::transition_t,_unsigned_long,_1UL>_>
                    *)&local_60);
        piVar3 = piVar3 + 1;
      } while (piVar3 != piVar1);
    }
    local_60._t = (make_shared_t<tchecker::graph::reachability::node_t<tchecker::zg::path::symbolic::node_t,_tchecker::zg::path::symbolic::edge_t>,_unsigned_long,_1UL>
                   *)0x0;
    intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::zg::path::symbolic::node_t,_tchecker::zg::path::symbolic::edge_t>,_unsigned_long,_1UL>_>
    ::reset(&local_60,
            (this->
            super_finite_path_t<tchecker::zg::path::symbolic::node_t,_tchecker::zg::path::symbolic::edge_t>
            )._last._t);
    if ((node_flags_t *)local_60._t != (node_flags_t *)0x0) {
      graph::node_flags_t::final((node_flags_t *)local_60._t,SUB41(local_3c,0));
      intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::zg::path::symbolic::node_t,_tchecker::zg::path::symbolic::edge_t>,_unsigned_long,_1UL>_>
      ::~intrusive_shared_ptr_t(&local_60);
      intrusive_shared_ptr_t<const_tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>
      ::~intrusive_shared_ptr_t(&local_50);
      return (finite_path_t *)this;
    }
  }
LAB_001ab328:
  __assert_fail("_t != nullptr",
                "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/../include/tchecker/utils/shared_objects.hh"
                ,0x1db,
                "T *tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::zg::path::symbolic::node_t, tchecker::zg::path::symbolic::edge_t>>>::operator->() const [T = tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::zg::path::symbolic::node_t, tchecker::zg::path::symbolic::edge_t>>]"
               );
}

Assistant:

tchecker::zg::path::symbolic::finite_path_t * compute_finite_path(std::shared_ptr<tchecker::zg::zg_t> const & zg,
                                                                  tchecker::vloc_t const & initial_vloc,
                                                                  std::vector<tchecker::const_vedge_sptr_t> const & seq,
                                                                  bool last_node_final)
{
  tchecker::zg::path::symbolic::finite_path_t * path = new tchecker::zg::path::symbolic::finite_path_t{zg};

  tchecker::zg::const_state_sptr_t s{tchecker::zg::initial(*zg, initial_vloc)};
  if (s.ptr() == nullptr) {
    delete path;
    throw std::invalid_argument("*** compute_finite_path(symbolic): no initial state with given tuple of locations");
  }

  path->add_first_node(s);
  path->first()->initial(true);

  for (tchecker::const_vedge_sptr_t const & vedge_ptr : seq) {
    s = path->last()->state_ptr();
    auto && [nexts, nextt] = tchecker::zg::next(*zg, s, *vedge_ptr);
    if (nexts.ptr() == nullptr || nextt.ptr() == nullptr) {
      delete path;
      throw std::invalid_argument("*** compute_finite_path(symbolic): sequence is not feasible from given initial locations");
    }
    path->extend_back(nextt, nexts);
  }

  path->last()->final(last_node_final);

  return path;
}